

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.cpp
# Opt level: O0

Mat * __thiscall imagestego::impl::HaarWavelet::inverse(HaarWavelet *this,Mat *mat)

{
  bool bVar1;
  Mat *in_RDI;
  future<cv::Mat> *f;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *__range2_1;
  Mat *mat_;
  iterator __end2;
  iterator __begin2;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range2;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> futures;
  vector<cv::Mat,_std::allocator<cv::Mat>_> _planes;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  Mat *dst;
  Mat *in_stack_fffffffffffffe48;
  _InputArray *in_stack_fffffffffffffe50;
  _InputArray *this_00;
  Mat *this_01;
  Size in_stack_fffffffffffffe78;
  vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *in_stack_fffffffffffffe80;
  void *in_stack_fffffffffffffe88;
  Size in_stack_fffffffffffffe90;
  Mat local_168 [96];
  reference local_108;
  future<cv::Mat> *local_100;
  __normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
  local_f8;
  _InputArray *local_f0;
  Mat *local_e8;
  reference local_c8;
  Mat *local_c0;
  __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> local_b8;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_b0;
  _InputArray local_a8;
  _OutputArray local_90;
  _InputArray local_68;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_50 [2];
  byte local_19;
  
  local_19 = 0;
  this_01 = in_RDI;
  cv::Mat::Mat(in_RDI);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x107736);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x107743);
  cv::_InputArray::_InputArray(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  cv::_OutputArray::_OutputArray
            ((_OutputArray *)in_stack_fffffffffffffe50,
             (vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffe48);
  cv::split(&local_68,&local_90);
  cv::_OutputArray::~_OutputArray((_OutputArray *)0x107795);
  cv::_InputArray::~_InputArray(&local_68);
  this_00 = &local_a8;
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::vector
            ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)0x1077b4);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(local_50);
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::reserve
            (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78);
  local_b0 = local_50;
  local_b8._M_current =
       (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(in_stack_fffffffffffffe48);
  local_c0 = (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)
                               in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                        *)this_00,
                       (__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) break;
    local_c8 = __gnu_cxx::
               __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
               operator*(&local_b8);
    local_e8 = (Mat *)std::cref<cv::Mat>(in_stack_fffffffffffffe48);
    std::
    async<imagestego::impl::HaarWavelet::inverse(cv::Mat_const&)::_lambda(cv::Mat_const&)_1_,std::reference_wrapper<cv::Mat_const>>
              ((type *)in_RDI,(reference_wrapper<const_cv::Mat> *)this_00);
    std::vector<std::future<cv::Mat>,std::allocator<std::future<cv::Mat>>>::
    emplace_back<std::future<cv::Mat>>
              ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)this_01,
               (future<cv::Mat> *)in_RDI);
    std::future<cv::Mat>::~future((future<cv::Mat> *)0x107895);
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&local_b8);
  }
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(local_50);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::reserve
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffe90,
             (size_type)in_stack_fffffffffffffe88);
  local_f0 = &local_a8;
  local_f8._M_current =
       (future<cv::Mat> *)
       std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::begin
                 ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)
                  in_stack_fffffffffffffe48);
  local_100 = (future<cv::Mat> *)
              std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::end
                        ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)
                         in_stack_fffffffffffffe48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
                        *)this_00,
                       (__normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
                        *)in_stack_fffffffffffffe48);
    if (!bVar1) break;
    local_108 = __gnu_cxx::
                __normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
                ::operator*(&local_f8);
    std::future<cv::Mat>::get((future<cv::Mat> *)in_stack_fffffffffffffe78);
    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::emplace_back<cv::Mat>
              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_01,in_RDI);
    cv::Mat::~Mat(local_168);
    __gnu_cxx::
    __normal_iterator<std::future<cv::Mat>_*,_std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>_>
    ::operator++(&local_f8);
  }
  cv::_InputArray::_InputArray
            (this_00,(vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_stack_fffffffffffffe48);
  cv::_OutputArray::_OutputArray((_OutputArray *)this_01,in_RDI);
  cv::merge((_InputArray *)&stack0xfffffffffffffe80,(_OutputArray *)&stack0xfffffffffffffe68);
  cv::_OutputArray::~_OutputArray((_OutputArray *)0x107a75);
  cv::_InputArray::~_InputArray((_InputArray *)&stack0xfffffffffffffe80);
  local_19 = 1;
  std::vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_>::~vector
            ((vector<std::future<cv::Mat>,_std::allocator<std::future<cv::Mat>_>_> *)this_01);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_01);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)this_01);
  if ((local_19 & 1) == 0) {
    cv::Mat::~Mat(in_RDI);
  }
  return this_01;
}

Assistant:

cv::Mat inverse(const cv::Mat& mat) {
        cv::Mat dst;
        std::vector<cv::Mat> planes, _planes;
        cv::split(mat, _planes);
        std::vector<std::future<cv::Mat>> futures;
        futures.reserve(_planes.size());
        for (const cv::Mat& mat_ : _planes) {
            futures.emplace_back(std::async(
                [](const cv::Mat& src) {
                    return inverseHorizontalLifting(inverseVerticalLifting(src));
                },
                std::cref(mat_)));
        }
        planes.reserve(_planes.size());
        for (auto&& f : futures) {
            planes.emplace_back(f.get());
        }
        cv::merge(planes, dst);
        return dst;
    }